

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O0

int zt_ptr_array_free(zt_ptr_array *array,int free_members)

{
  void *__ptr;
  int in_ESI;
  void *in_RDI;
  void *memb;
  int32_t i;
  undefined4 local_18;
  undefined4 local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = -1;
  }
  else {
    if (0 < in_ESI) {
      for (local_18 = 0; local_18 < *(int *)((long)in_RDI + 4); local_18 = local_18 + 1) {
        __ptr = *(void **)(*(long *)((long)in_RDI + 8) + (long)local_18 * 8);
        if (__ptr != (void *)0x0) {
          if (*(long *)((long)in_RDI + 0x18) == 0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)((long)in_RDI + 0x18))(__ptr);
          }
        }
      }
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
      *(undefined8 *)((long)in_RDI + 8) = 0;
    }
    if (in_RDI != (void *)0x0) {
      free(in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
zt_ptr_array_free(zt_ptr_array * array, int free_members) {
    int32_t i;

    if (array == NULL) {
        return -1;
    }

    if (free_members > 0) {
        for (i = 0; i < array->count; i++) {
            void * memb;

            if ((memb = array->array[i]) == NULL) {
                continue;
            }

            if (array->free_cb) {
                (array->free_cb)(memb);
            } else {
                zt_free(memb);
            }
        }
    }

    zt_free(array->array);
    zt_free(array);

    return 0;
}